

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

var __thiscall
cs_impl::runtime_cs_ext::wait_for(runtime_cs_ext *this,numeric *mill_sec,var *func,array *argument)

{
  longdouble lVar1;
  bool bVar2;
  type_info *ptVar3;
  callable *pcVar4;
  object_method *poVar5;
  long *plVar6;
  size_t sVar7;
  initializer_list<cs_impl::any> __l;
  allocator_type local_109;
  any local_108;
  vector args;
  uint *local_c8;
  long local_c0;
  uint local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> local_a8;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> local_88;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> local_68;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> local_48;
  
  ptVar3 = any::type(func);
  bVar2 = std::type_info::operator==(ptVar3,(type_info *)&cs::callable::typeinfo);
  if (bVar2) {
    local_48._M_cur =
         (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_start._M_cur;
    local_48._M_first =
         (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_start._M_first;
    local_48._M_last =
         (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_start._M_last;
    local_48._M_node =
         (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_start._M_node;
    local_68._M_cur =
         (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_finish._M_cur;
    local_68._M_first =
         (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_finish._M_first;
    local_68._M_last =
         (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_finish._M_last;
    local_68._M_node =
         (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_finish._M_node;
    std::vector<cs_impl::any,std::allocator<cs_impl::any>>::
    vector<std::_Deque_iterator<cs_impl::any,cs_impl::any_const&,cs_impl::any_const*>,void>
              ((vector<cs_impl::any,std::allocator<cs_impl::any>> *)&args,&local_48,&local_68,
               (allocator_type *)&local_108);
    bVar2 = mill_sec->type;
    sVar7 = (mill_sec->data)._int;
    lVar1 = *(longdouble *)&mill_sec->data;
    pcVar4 = any::const_val<cs::callable>(func);
    if (bVar2 == false) {
      sVar7 = (long)ROUND(lVar1);
    }
    wait_for_impl(this,sVar7,pcVar4,&args);
  }
  else {
    ptVar3 = any::type(func);
    bVar2 = std::type_info::operator==(ptVar3,(type_info *)&cs::object_method::typeinfo);
    if (!bVar2) {
      plVar6 = (long *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string
                ((string *)&local_c8,"Invoke non-callable object.",(allocator *)&args);
      *plVar6 = (long)(plVar6 + 2);
      if (local_c8 == &local_b8) {
        *(uint *)(plVar6 + 2) = local_b8;
        *(undefined4 *)((long)plVar6 + 0x14) = uStack_b4;
        *(undefined4 *)(plVar6 + 3) = uStack_b0;
        *(undefined4 *)((long)plVar6 + 0x1c) = uStack_ac;
      }
      else {
        *plVar6 = (long)local_c8;
        plVar6[2] = CONCAT44(uStack_b4,local_b8);
      }
      plVar6[1] = local_c0;
      local_c0 = 0;
      local_b8 = local_b8 & 0xffffff00;
      local_c8 = &local_b8;
      __cxa_throw(plVar6,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
    }
    poVar5 = any::const_val<cs::object_method>(func);
    local_108.mDat = (poVar5->object).mDat;
    if (local_108.mDat != (proxy *)0x0) {
      (local_108.mDat)->refcount = (local_108.mDat)->refcount + 1;
    }
    __l._M_len = 1;
    __l._M_array = &local_108;
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector(&args,__l,&local_109);
    any::recycle(&local_108);
    local_88._M_cur =
         (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_start._M_cur;
    local_88._M_first =
         (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_start._M_first;
    local_88._M_last =
         (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_start._M_last;
    local_88._M_node =
         (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_start._M_node;
    local_a8._M_cur =
         (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_finish._M_cur;
    local_a8._M_first =
         (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_finish._M_first;
    local_a8._M_last =
         (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_finish._M_last;
    local_a8._M_node =
         (argument->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_finish._M_node;
    std::vector<cs_impl::any,std::allocator<cs_impl::any>>::
    insert<std::_Deque_iterator<cs_impl::any,cs_impl::any_const&,cs_impl::any_const*>,void>
              ((vector<cs_impl::any,std::allocator<cs_impl::any>> *)&args,
               (const_iterator)
               args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_88,&local_a8);
    bVar2 = mill_sec->type;
    sVar7 = (mill_sec->data)._int;
    lVar1 = *(longdouble *)&mill_sec->data;
    pcVar4 = any::const_val<cs::callable>(&poVar5->callable);
    if (bVar2 == false) {
      sVar7 = (long)ROUND(lVar1);
    }
    wait_for_impl(this,sVar7,pcVar4,&args);
  }
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&args);
  return (var)(proxy *)this;
}

Assistant:

cs::var wait_for(const cs::numeric& mill_sec, const cs::var &func, const cs::array &argument)
		{
			if (func.type() == typeid(cs::callable)) {
				cs::vector args(argument.begin(), argument.end());
				return wait_for_impl(mill_sec.as_integer(), func.const_val<cs::callable>(), args);
			}
			else if (func.type() == typeid(cs::object_method)) {
				const auto &om = func.const_val<cs::object_method>();
				cs::vector args{om.object};
				args.insert(args.end(), argument.begin(), argument.end());
				return wait_for_impl(mill_sec.as_integer(), om.callable.const_val<cs::callable>(), args);
			}
			else
				throw cs::lang_error("Invoke non-callable object.");
		}